

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_inverse_var(secp256k1_scalar *r,secp256k1_scalar *x)

{
  int iVar1;
  int iVar2;
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_signed62 sStack_48;
  
  iVar1 = secp256k1_scalar_is_zero(x);
  secp256k1_scalar_verify(x);
  secp256k1_scalar_to_signed62(&sStack_48,x);
  secp256k1_modinv64_var(&sStack_48,&secp256k1_const_modinfo_scalar);
  secp256k1_scalar_from_signed62(r,&sStack_48);
  secp256k1_scalar_verify(r);
  iVar2 = secp256k1_scalar_is_zero(r);
  if (iVar2 == iVar1) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/scalar_4x64_impl.h"
          ,0x3df,"test condition failed: secp256k1_scalar_is_zero(r) == zero_in");
  abort();
}

Assistant:

static void secp256k1_scalar_inverse_var(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}